

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O3

void __thiscall
basisu::vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node>::push_back
          (vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node> *this,
          tsvq_node *obj)

{
  uint uVar1;
  uint *__dest;
  uint *__src;
  uint64_t uVar2;
  undefined4 uVar3;
  int32_t iVar4;
  uint32_t i;
  tsvq_node *ptVar5;
  long lVar6;
  ulong uVar7;
  
  ptVar5 = this->m_p;
  uVar1 = this->m_size;
  uVar7 = (ulong)uVar1;
  if (ptVar5 + uVar7 <= obj || (obj < ptVar5 || ptVar5 == (tsvq_node *)0x0)) {
    if (this->m_capacity <= uVar1) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this,uVar1 + 1,true,0x48,object_mover,false);
      ptVar5 = this->m_p;
      uVar7 = (ulong)this->m_size;
    }
    ptVar5 = ptVar5 + uVar7;
    uVar3 = *(undefined4 *)&obj->field_0x4;
    uVar2 = obj->m_weight;
    ptVar5->m_var = obj->m_var;
    *(undefined4 *)&ptVar5->field_0x4 = uVar3;
    ptVar5->m_weight = uVar2;
    lVar6 = 0;
    do {
      (ptVar5->m_origin).m_v[lVar6] = (obj->m_origin).m_v[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    iVar4 = obj->m_right_index;
    ptVar5->m_left_index = obj->m_left_index;
    ptVar5->m_right_index = iVar4;
    (ptVar5->m_training_vecs).m_p = (uint *)0x0;
    (ptVar5->m_training_vecs).m_size = 0;
    (ptVar5->m_training_vecs).m_capacity = 0;
    elemental_vector::increase_capacity
              ((elemental_vector *)&ptVar5->m_training_vecs,(obj->m_training_vecs).m_size,false,4,
               (object_mover)0x0,false);
    uVar1 = (obj->m_training_vecs).m_size;
    (ptVar5->m_training_vecs).m_size = uVar1;
    __dest = (ptVar5->m_training_vecs).m_p;
    if ((__dest != (uint *)0x0) && (__src = (obj->m_training_vecs).m_p, __src != (uint *)0x0)) {
      memcpy(__dest,__src,(ulong)uVar1 << 2);
    }
    ptVar5->m_codebook_index = obj->m_codebook_index;
    this->m_size = this->m_size + 1;
    return;
  }
  __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x267,
                "void basisu::vector<basisu::tree_vector_quant<basisu::vec<6, float>>::tsvq_node>::push_back(const T &) [T = basisu::tree_vector_quant<basisu::vec<6, float>>::tsvq_node]"
               );
}

Assistant:

BASISU_FORCE_INLINE void push_back(const T& obj)
      {
         assert(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
            increase_capacity(m_size + 1, true);

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;
      }